

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O0

void __thiscall WebServer::returnConn(WebServer *this,HttpConnPtr *conn)

{
  EventLoop *this_00;
  WebServer *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  Functor local_38;
  HttpConnPtr *local_18;
  HttpConnPtr *conn_local;
  WebServer *this_local;
  
  this_00 = this->loop_;
  local_70 = returnConnInLoop;
  local_68 = 0;
  local_78 = this;
  local_18 = conn;
  conn_local = (HttpConnPtr *)this;
  std::bind<void(WebServer::*)(std::shared_ptr<HttpConn>),WebServer*,std::shared_ptr<HttpConn>>
            (&local_60,(offset_in_WebServer_to_subr *)&local_70,&local_78,conn);
  std::function<void()>::
  function<std::_Bind<void(WebServer::*(WebServer*,std::shared_ptr<HttpConn>))(std::shared_ptr<HttpConn>)>,void>
            ((function<void()> *)&local_38,&local_60);
  EventLoop::runInLoop(this_00,&local_38);
  std::function<void_()>::~function(&local_38);
  std::_Bind<void_(WebServer::*(WebServer_*,_std::shared_ptr<HttpConn>))(std::shared_ptr<HttpConn>)>
  ::~_Bind(&local_60);
  return;
}

Assistant:

void WebServer::returnConn(HttpConnPtr conn) {
    loop_->runInLoop(std::bind(&WebServer::returnConnInLoop, this, std::move(conn)));
}